

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlReplaceNode(void)

{
  int iVar1;
  int iVar2;
  int local_34;
  xmlNodePtr pxStack_30;
  int n_cur;
  xmlNodePtr cur;
  xmlNodePtr pxStack_20;
  int n_old;
  xmlNodePtr old;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 3; cur._4_4_ = cur._4_4_ + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      pxStack_20 = gen_xmlNodePtr(cur._4_4_,0);
      pxStack_30 = gen_xmlNodePtr_in(local_34,1);
      xmlReplaceNode(pxStack_20,pxStack_30);
      if (pxStack_30 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxStack_30);
        xmlFreeNode(pxStack_30);
        pxStack_30 = (xmlNodePtr)0x0;
      }
      if (pxStack_20 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxStack_20);
        xmlFreeNode(pxStack_20);
        pxStack_20 = (xmlNodePtr)0x0;
      }
      desret_xmlNodePtr((xmlNodePtr)0x0);
      call_tests = call_tests + 1;
      des_xmlNodePtr(cur._4_4_,pxStack_20,0);
      des_xmlNodePtr_in(local_34,pxStack_30,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)cur._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlReplaceNode(void) {
    int test_ret = 0;

#if defined(LIBXML_TREE_ENABLED) || defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    xmlNodePtr ret_val;
    xmlNodePtr old; /* the old node */
    int n_old;
    xmlNodePtr cur; /* the node */
    int n_cur;

    for (n_old = 0;n_old < gen_nb_xmlNodePtr;n_old++) {
    for (n_cur = 0;n_cur < gen_nb_xmlNodePtr_in;n_cur++) {
        mem_base = xmlMemBlocks();
        old = gen_xmlNodePtr(n_old, 0);
        cur = gen_xmlNodePtr_in(n_cur, 1);

        ret_val = xmlReplaceNode(old, cur);
        if (cur != NULL) {
              xmlUnlinkNode(cur);
              xmlFreeNode(cur) ; cur = NULL ; }
          if (old != NULL) {
              xmlUnlinkNode(old);
              xmlFreeNode(old) ; old = NULL ; }
	  ret_val = NULL;
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_old, old, 0);
        des_xmlNodePtr_in(n_cur, cur, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlReplaceNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_old);
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}